

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O0

XrGeneratedDispatchTableCore *
RuntimeInterface::GetDebugUtilsMessengerDispatchTable(XrDebugUtilsMessengerEXT messenger)

{
  bool bVar1;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar2;
  pointer pRVar3;
  pointer ppVar4;
  XrGeneratedDispatchTableCore *pXVar5;
  _Node_iterator_base<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>,_false>
  local_40 [3];
  _Node_iterator_base<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>,_false> local_28;
  iterator it;
  lock_guard<std::mutex> mlock;
  XrInstance runtime_instance;
  XrDebugUtilsMessengerEXT messenger_local;
  
  mlock._M_device = (mutex_type *)0x0;
  runtime_instance = (XrInstance)messenger;
  puVar2 = GetInstance();
  pRVar3 = std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::operator->
                     (puVar2);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&it,&pRVar3->_messenger_to_instance_mutex);
  puVar2 = GetInstance();
  pRVar3 = std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::operator->
                     (puVar2);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<XrDebugUtilsMessengerEXT_T_*,_XrInstance_T_*,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>_>
       ::find(&pRVar3->_messenger_to_instance_map,(key_type *)&runtime_instance);
  puVar2 = GetInstance();
  pRVar3 = std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::operator->
                     (puVar2);
  local_40[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<XrDebugUtilsMessengerEXT_T_*,_XrInstance_T_*,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>_>
       ::end(&pRVar3->_messenger_to_instance_map);
  bVar1 = std::__detail::operator!=(&local_28,local_40);
  if (bVar1) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>,_false,_false>
                           *)&local_28);
    mlock._M_device = (mutex_type *)ppVar4->second;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  pXVar5 = GetDispatchTable((XrInstance)mlock._M_device);
  return pXVar5;
}

Assistant:

const XrGeneratedDispatchTableCore* RuntimeInterface::GetDebugUtilsMessengerDispatchTable(XrDebugUtilsMessengerEXT messenger) {
    XrInstance runtime_instance = XR_NULL_HANDLE;
    {
        std::lock_guard<std::mutex> mlock(GetInstance()->_messenger_to_instance_mutex);
        auto it = GetInstance()->_messenger_to_instance_map.find(messenger);
        if (it != GetInstance()->_messenger_to_instance_map.end()) {
            runtime_instance = it->second;
        }
    }
    return GetDispatchTable(runtime_instance);
}